

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

NULLCRef * NULLCTypeInfo::MemberByIndex(NULLCRef *__return_storage_ptr__,NULLCRef obj,int member)

{
  uint uVar1;
  long lVar2;
  char *__function;
  long lVar3;
  long lVar4;
  
  lVar3 = linker;
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x4a,"NULLCRef NULLCTypeInfo::MemberByIndex(NULLCRef, int)");
  }
  __return_storage_ptr__->ptr = (char *)0x0;
  __return_storage_ptr__->typeID = 0;
  if (obj.typeID < *(uint *)(lVar3 + 0x20c)) {
    lVar2 = *(long *)(lVar3 + 0x200);
    lVar4 = (ulong)obj.typeID * 0x50;
    if ((*(int *)(lVar2 + 0x10 + lVar4) == 4) && ((uint)member < *(uint *)(lVar2 + 0x18 + lVar4))) {
      uVar1 = *(uint *)(lVar2 + lVar4 + 0x24);
      if (*(uint *)(lVar3 + 0x21c) <= uVar1) {
        __function = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_0012aa93;
      }
      lVar3 = (ulong)uVar1 * 0xc + *(long *)(lVar3 + 0x210);
      __return_storage_ptr__->typeID = *(uint *)(lVar3 + (long)member * 0xc);
      __return_storage_ptr__->ptr = obj.ptr + *(uint *)(lVar3 + 8 + (long)member * 0xc);
    }
    return __return_storage_ptr__;
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0012aa93:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

NULLCRef MemberByIndex(NULLCRef obj, int member)
	{
		assert(linker);
		NULLCRef ret;
		ret.ptr = NULL;
		ret.typeID = 0;

		ExternTypeInfo &exType = linker->exTypes[obj.typeID];
		if((exType.subCat != ExternTypeInfo::CAT_CLASS) || ((unsigned)member >= exType.memberCount))
			return ret;

		ExternMemberInfo *memberList = &linker->exTypeExtra[exType.memberOffset];
		ret.typeID = memberList[member].type;
		ret.ptr = obj.ptr + memberList[member].offset;
		return ret;
	}